

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

void __thiscall
gl4cts::EnhancedLayouts::VaryingLocationsTest::getProgramInterface
          (VaryingLocationsTest *this,GLuint test_case_index,ProgramInterface *program_interface,
          VaryingPassthrough *varying_passthrough)

{
  Type local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  local_48 = TestBase::getType((TestBase *)this,test_case_index);
  Utils::Type::GenerateDataPacked(&local_38,&local_48);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&this->m_first_data,&local_38);
  if (local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  Utils::Type::GenerateDataPacked(&local_38,&local_48);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&this->m_last_data,&local_38);
  if (local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  (*(this->super_TextureTestBase).super_TestBase.super_TestCase.super_TestCase.super_TestNode.
    _vptr_TestNode[0x21])(this,5,&local_48,program_interface,varying_passthrough);
  (*(this->super_TextureTestBase).super_TestBase.super_TestCase.super_TestCase.super_TestNode.
    _vptr_TestNode[0x21])(this,4,&local_48,program_interface,varying_passthrough);
  (*(this->super_TextureTestBase).super_TestBase.super_TestCase.super_TestCase.super_TestNode.
    _vptr_TestNode[0x21])(this,2,&local_48,program_interface,varying_passthrough);
  (*(this->super_TextureTestBase).super_TestBase.super_TestCase.super_TestCase.super_TestNode.
    _vptr_TestNode[0x21])(this,3,&local_48,program_interface,varying_passthrough);
  (*(this->super_TextureTestBase).super_TestBase.super_TestCase.super_TestCase.super_TestNode.
    _vptr_TestNode[0x21])(this,1,&local_48,program_interface,varying_passthrough);
  return;
}

Assistant:

void VaryingLocationsTest::getProgramInterface(GLuint test_case_index, Utils::ProgramInterface& program_interface,
											   Utils::VaryingPassthrough& varying_passthrough)
{
	const Utils::Type type = getType(test_case_index);

	m_first_data = type.GenerateDataPacked();
	m_last_data  = type.GenerateDataPacked();

	prepareShaderStage(Utils::Shader::FRAGMENT, type, program_interface, varying_passthrough);
	prepareShaderStage(Utils::Shader::GEOMETRY, type, program_interface, varying_passthrough);
	prepareShaderStage(Utils::Shader::TESS_CTRL, type, program_interface, varying_passthrough);
	prepareShaderStage(Utils::Shader::TESS_EVAL, type, program_interface, varying_passthrough);
	prepareShaderStage(Utils::Shader::VERTEX, type, program_interface, varying_passthrough);
}